

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_sse41.h
# Opt level: O0

void __thiscall highwayhash::SSE41::HHStateSSE41::Finalize(HHStateSSE41 *this,HHResult64 *result)

{
  HHResult64 extraout_XMM0_Qa;
  SSE41 local_78 [8];
  V2x64U hash;
  V2x64U sum1;
  V2x64U sum0;
  int local_3c;
  int n;
  HHResult64 *result_local;
  HHStateSSE41 *this_local;
  
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    PermuteAndUpdate(this);
  }
  operator+((SSE41 *)(sum1.v_ + 1),&this->v0L,&this->mul0L);
  operator+((SSE41 *)(hash.v_ + 1),&this->v1L,&this->mul1L);
  operator+(local_78,(V128<unsigned_long> *)(sum1.v_ + 1),(V128<unsigned_long> *)(hash.v_ + 1));
  V128::operator_cast_to_function_pointer((V128 *)local_78);
  *result = extraout_XMM0_Qa;
  return;
}

Assistant:

HH_INLINE void Finalize(HHResult64* HH_RESTRICT result) {
    // Mix together all lanes.
    for (int n = 0; n < 4; n++) {
      PermuteAndUpdate();
    }

    const V2x64U sum0 = v0L + mul0L;
    const V2x64U sum1 = v1L + mul1L;
    const V2x64U hash = sum0 + sum1;
    _mm_storel_epi64(reinterpret_cast<__m128i*>(result), hash);
  }